

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_scan_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,int q)

{
  long lVar1;
  int iVar2;
  bsp_pid_t bVar3;
  uint uVar4;
  void *local_c8;
  bsc_pid_t local_bc;
  int local_b8;
  bsc_pid_t local_b0;
  void *local_a8;
  void *local_a0;
  int local_90;
  void *local_88;
  void *last;
  bsc_size_t shift;
  void *prefix;
  char *tmp2;
  char *tmp1;
  char *dst_bytes;
  bsc_pid_t s;
  bsc_pid_t range;
  bsc_pid_t P;
  bsc_pid_t k;
  bsc_pid_t j;
  bsc_pid_t i;
  group_t *g;
  bsc_reduce_t reducer_local;
  void *tmp_space_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_step_t depends_local;
  
  range = 0;
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    local_90 = bsp_pid();
  }
  else {
    iVar2 = *group;
    lVar1 = *(long *)((long)group + 8);
    bVar3 = bsp_pid();
    local_90 = *(int *)(lVar1 + (long)bVar3 * 4);
  }
  local_c8 = (void *)((long)tmp_space + (long)(iVar2 * size));
  (*reducer)(dst,zero,src,size * nmemb);
  group_local._4_4_ = depends;
  for (dst_bytes._4_4_ = 1; dst_bytes._4_4_ < iVar2; dst_bytes._4_4_ = q * dst_bytes._4_4_) {
    uVar4 = (uint)(dst_bytes._4_4_ == 1);
    if (dst_bytes._4_4_ == 1) {
      if (nmemb == 0) {
        local_a0 = zero;
      }
      else {
        local_a0 = (void *)((long)dst + (long)((nmemb + -1) * size));
      }
      local_88 = local_a0;
    }
    else {
      if (range == 0) {
        local_a8 = zero;
      }
      else {
        local_a8 = (void *)((long)local_c8 + (long)((range + -1) * size));
      }
      local_88 = local_a8;
    }
    for (k = 1; k < q; k = k + 1) {
      local_b0 = local_90 + dst_bytes._4_4_ * k + uVar4;
      if (local_b0 < iVar2) {
        if (group != (bsc_group_t)0x0) {
          local_b0 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)local_b0 * 4);
        }
        bsc_put(group_local._4_4_,local_b0,local_88,tmp_space,k * size,size);
      }
    }
    if ((int)((dst_bytes._4_4_ + local_90) - uVar4) / dst_bytes._4_4_ < q) {
      local_b8 = (int)((dst_bytes._4_4_ + local_90) - uVar4) / dst_bytes._4_4_;
    }
    else {
      local_b8 = q;
    }
    range = local_b8;
    if (local_90 < (int)(iVar2 - uVar4)) {
      if (group == (bsc_group_t)0x0) {
        local_bc = local_90 + uVar4;
      }
      else {
        local_bc = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)(int)(local_90 + uVar4) * 4)
        ;
      }
      bsc_put(group_local._4_4_,local_bc,local_88,tmp_space,0,size);
    }
    bsc_exec_reduce(group_local._4_4_,reducer,local_c8,zero,tmp_space,size * local_b8);
    group_local._4_4_ = group_local._4_4_ + 1;
  }
  if (range < 1) {
    local_c8 = zero;
  }
  else {
    local_c8 = (void *)((long)local_c8 + (long)((range + -1) * size));
  }
  bVar3 = bsp_pid();
  bsc_put(group_local._4_4_,bVar3,local_c8,tmp_space,0,size);
  bsc_exec_reduce(group_local._4_4_,reducer,dst,tmp_space,src,size * nmemb);
  return group_local._4_4_ + 1;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_scan_qtree_single( bsc_step_t depends, 
        bsc_group_t group, const void * src, void * dst, void * tmp_space, 
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size,
        int q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k=0, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * dst_bytes = dst;
    char * tmp1 = tmp_space;
    char * tmp2 = tmp1 + P * size;
    const void * prefix;

    (*reducer)( dst, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        const bsc_size_t shift = (range==1);
        const void * last = NULL;
        if (range == 1)
            last = (nmemb==0 ? zero : &dst_bytes[(nmemb-1)*size]);
        else
            last = (k==0 ? zero : &tmp2[(k-1)*size]);

        for ( i = 1; i < q; ++i ) {
            j = s + range * i + shift;
            if ( j < P ) {
                bsc_put( depends, g?g->gid[j]:j, last, tmp1, i * size, size);
            }
        }
    
        /* k is number of received elements */
        k = MIN( q, (range+s-shift)/range);

        if (s < P - shift) {
            j = g?g->gid[s+shift]:s+shift;
            bsc_put(depends, j, last, tmp1, 0, size);
        }
        bsc_exec_reduce( depends, reducer, tmp2, zero, tmp1, size*k );
        depends += 1;
    }

    prefix = k > 0 ? &tmp2[(k-1)*size] : zero ;
    bsc_put(depends, bsp_pid(), prefix, tmp1, 0, size);

    bsc_exec_reduce( depends, reducer, dst, tmp1, src, size*nmemb );
    return depends+1;
}